

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O0

long wasm::bit_cast<long,double>(double *source)

{
  long destination;
  double *source_local;
  
  return (long)*source;
}

Assistant:

inline Destination bit_cast(const Source& source) {
  static_assert(sizeof(Destination) == sizeof(Source),
                "bit_cast needs to be between types of the same size");
  static_assert(std::is_trivial_v<Destination> &&
                  std::is_standard_layout_v<Destination>,
                "non-POD bit_cast undefined");
  static_assert(std::is_trivial_v<Source> && std::is_standard_layout_v<Source>,
                "non-POD bit_cast undefined");
  Destination destination;
  std::memcpy(&destination, &source, sizeof(destination));
  return destination;
}